

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxjenkins.c
# Opt level: O1

void USPE_seasonal(double *inp,int N,int s,int p,int q,double *phi,double *theta)

{
  size_t sVar1;
  int iVar2;
  uint uVar3;
  double *acov;
  void *__src;
  double *A;
  double *b;
  int *ipiv;
  double *__dest;
  undefined8 *__ptr;
  double *array;
  double *__s;
  double *x;
  double *A_00;
  int *ipiv_00;
  double *pdVar4;
  uint N_00;
  ulong uVar5;
  double *pdVar6;
  uint uVar7;
  ulong uVar8;
  double *pdVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  bool bVar17;
  double dVar18;
  
  uVar14 = (ulong)(uint)q;
  iVar2 = (q + 1 + p) * s;
  acov = (double *)malloc((long)iVar2 * 8);
  __src = malloc((long)(q + p) * 8 + 8);
  lVar16 = (long)p;
  A = (double *)malloc(lVar16 * 8 * lVar16);
  b = (double *)malloc(lVar16 * 8);
  ipiv = (int *)malloc(lVar16 * 4);
  lVar15 = (long)q;
  sVar1 = lVar15 * 8 + 8;
  __dest = (double *)malloc(sVar1);
  __ptr = (undefined8 *)malloc(lVar16 * 8 + 8);
  array = (double *)malloc(sVar1);
  __s = (double *)malloc(sVar1);
  x = (double *)malloc(sVar1);
  A_00 = (double *)malloc((lVar15 + 1) * sVar1);
  ipiv_00 = (int *)malloc(lVar15 * 4 + 4);
  autocovar(inp,N,acov,iVar2);
  if (-1 < q + p) {
    uVar8 = 0;
    pdVar4 = acov;
    do {
      *(double *)((long)__src + uVar8 * 8) = *pdVar4;
      uVar8 = uVar8 + 1;
      pdVar4 = pdVar4 + s;
    } while (q + p + 1 != uVar8);
  }
  *__ptr = 0xbff0000000000000;
  uVar8 = (ulong)(uint)p;
  if (0 < p) {
    memset(phi,0,uVar8 * 8);
  }
  if (0 < q) {
    memset(theta,0,uVar14 * 8);
  }
  if (0 < p) {
    lVar16 = 1;
    uVar5 = uVar14;
    pdVar4 = A;
    do {
      iVar2 = (int)uVar5;
      uVar11 = 0;
      do {
        iVar10 = (int)uVar5;
        uVar12 = (ulong)(uint)-iVar10;
        if (0 < iVar10) {
          uVar12 = uVar5;
        }
        pdVar4[uVar11] = *(double *)((long)__src + uVar12 * 8);
        uVar11 = uVar11 + 1;
        uVar5 = (ulong)(iVar10 - 1);
      } while (uVar8 != uVar11);
      lVar16 = lVar16 + 1;
      pdVar4 = pdVar4 + uVar8;
      uVar5 = (ulong)(iVar2 + 1);
    } while (lVar16 != uVar8 + 1);
    memcpy(b,(void *)((long)__src + lVar15 * 8 + 8),uVar8 * 8);
    ludecomp(A,p,ipiv);
    linsolve(A,p,b,ipiv,phi);
  }
  if (0 < p) {
    memcpy(__ptr + 1,phi,uVar8 << 3);
  }
  if (p == 0) {
    if (-1 < q) {
      memcpy(__dest,__src,uVar14 * 8 + 8);
    }
  }
  else if (-1 < q) {
    uVar8 = 0;
    do {
      dVar18 = 0.0;
      if (-1 < p) {
        uVar5 = uVar8 & 0xffffffff;
        uVar11 = 0;
        do {
          iVar2 = (int)uVar5;
          uVar12 = 0;
          do {
            iVar10 = (int)uVar5;
            uVar13 = (ulong)(uint)-iVar10;
            if (0 < iVar10) {
              uVar13 = uVar5;
            }
            dVar18 = dVar18 + (double)__ptr[uVar12] * (double)__ptr[uVar11] *
                              *(double *)((long)__src + uVar13 * 8);
            uVar12 = uVar12 + 1;
            uVar5 = (ulong)(iVar10 - 1);
          } while (p + 1 != uVar12);
          uVar11 = uVar11 + 1;
          uVar5 = (ulong)(iVar2 + 1);
        } while (uVar11 != p + 1);
      }
      __dest[uVar8] = dVar18;
      uVar8 = uVar8 + 1;
    } while (uVar8 != q + 1);
  }
  if (-1 < q) {
    sVar1 = uVar14 * 8 + 8;
    memset(__s,0,sVar1);
    memset(array,0,sVar1);
  }
  dVar18 = *__dest;
  if (dVar18 < 0.0) {
    dVar18 = sqrt(dVar18);
  }
  else {
    dVar18 = SQRT(dVar18);
  }
  N_00 = q + 1;
  *__s = dVar18;
  if (-1 < q) {
    uVar3 = q + 1;
    uVar8 = (ulong)uVar3;
    uVar5 = 0;
    pdVar4 = __s;
    do {
      if (uVar5 <= uVar14) {
        dVar18 = array[uVar5];
        uVar11 = 0;
        do {
          dVar18 = dVar18 + __s[uVar11] * pdVar4[uVar11];
          uVar11 = uVar11 + 1;
        } while (uVar3 != uVar11);
        array[uVar5] = dVar18;
      }
      array[uVar5] = array[uVar5] - __dest[uVar5];
      uVar5 = uVar5 + 1;
      uVar3 = uVar3 - 1;
      pdVar4 = pdVar4 + 1;
    } while (uVar5 != uVar8);
  }
  dVar18 = array_max_abs(array,N_00);
  uVar14 = (ulong)N_00;
  if (0.0001 < dVar18) {
    uVar3 = 0;
    do {
      if (-1 < q) {
        lVar16 = 0;
        uVar8 = 0;
        pdVar4 = __s;
        pdVar6 = __s;
        pdVar9 = A_00;
        do {
          uVar5 = 0;
          do {
            dVar18 = 0.0;
            if ((long)(uVar8 + uVar5) <= lVar15) {
              dVar18 = pdVar4[uVar5] + 0.0;
            }
            if (-1 < (long)(lVar16 + uVar5)) {
              dVar18 = dVar18 + pdVar6[uVar5];
            }
            pdVar9[uVar5] = dVar18;
            uVar5 = uVar5 + 1;
          } while (uVar14 != uVar5);
          uVar8 = uVar8 + 1;
          pdVar9 = pdVar9 + uVar14;
          lVar16 = lVar16 + -1;
          pdVar6 = pdVar6 + -1;
          pdVar4 = pdVar4 + 1;
        } while (uVar8 != uVar14);
      }
      ludecomp(A_00,N_00,ipiv_00);
      linsolve(A_00,N_00,array,ipiv_00,x);
      if (-1 < q) {
        memset(array,0,uVar14 * 8);
        uVar8 = 0;
        do {
          __s[uVar8] = __s[uVar8] - x[uVar8];
          uVar8 = uVar8 + 1;
        } while (uVar14 != uVar8);
      }
      if (-1 < q) {
        uVar8 = 0;
        pdVar4 = __s;
        uVar7 = N_00;
        do {
          if ((long)uVar8 <= lVar15) {
            dVar18 = array[uVar8];
            uVar5 = 0;
            do {
              dVar18 = dVar18 + __s[uVar5] * pdVar4[uVar5];
              uVar5 = uVar5 + 1;
            } while (uVar7 != uVar5);
            array[uVar8] = dVar18;
          }
          array[uVar8] = array[uVar8] - __dest[uVar8];
          uVar8 = uVar8 + 1;
          uVar7 = uVar7 - 1;
          pdVar4 = pdVar4 + 1;
        } while (uVar8 != uVar14);
      }
      dVar18 = array_max_abs(array,N_00);
    } while ((0.0001 < dVar18) && (bVar17 = uVar3 < 199, uVar3 = uVar3 + 1, bVar17));
  }
  if (0 < q) {
    dVar18 = *__s;
    lVar15 = 0;
    do {
      theta[lVar15] = -__s[lVar15 + 1] / dVar18;
      lVar15 = lVar15 + 1;
    } while (uVar14 - 1 != lVar15);
  }
  free(__src);
  free(acov);
  free(A);
  free(b);
  free(ipiv);
  free(__dest);
  free(__ptr);
  free(array);
  free(__s);
  free(A_00);
  free(ipiv_00);
  free(x);
  return;
}

Assistant:

void USPE_seasonal(double *inp,int N,int s,int p, int q, double *phi,double *theta) {
	int K,i,j,l,t,temp,it1;
	double tempd,epsilon;
	double *b,*c,*A,*c2,*x,*f,*tau,*T,*h,*cv;
	int *ipiv,*ipiv2;

	K = (p + q + 1) * s;

	cv = (double *) malloc(sizeof(double) * K);
	c = (double *) malloc(sizeof(double) * (p+q+1));
	A = (double *) malloc(sizeof(double) * p * p);
	b = (double *) malloc(sizeof(double) * p);
	ipiv = (int *) malloc(sizeof(int) * p);
	c2 = (double *) malloc(sizeof(double) * (q+1));
	x = (double *) malloc(sizeof(double) * (p+1));
	f = (double *) malloc(sizeof(double) * (q+1));
	tau = (double *) malloc(sizeof(double) * (q+1));
	h = (double *) malloc(sizeof(double) * (q+1));
	T = (double *) malloc(sizeof(double) * (q+1) * (q+1));
	ipiv2 = (int *) malloc(sizeof(int) * (q+1));


	autocovar(inp,N,cv,K);
	for(i = 0; i < p+q+1;++i) {
		c[i] = cv[i*s];
	}

	x[0] = -1.0;

	for(i = 0; i < p;++i) {
		phi[i] = 0.0;
	}

	for(i = 0; i < q;++i) {
		theta[i] = 0.0;
	}

	//Step 1
	if (p > 0) {

		for(i = 1; i <= p;++i) {
			t = (i-1) * p;
			for(j = 1; j <= p;++j) {
				temp = q+i-j;
				if (temp < 0) {
					temp = -temp;
				}
				A[t+j-1] = c[temp];
			}
		}

		for(i = 0; i < p;++i) {
			b[i] = c[q+i+1];
		}

		ludecomp(A,p,ipiv);
		linsolve(A,p,b,ipiv,phi);

	}


	for(i = 0; i < p;++i) {
		x[i+1] = phi[i];
	}

	// Step 2
	if (p == 0) {
		for(i = 0; i < q + 1; ++i) {
			c2[i] = c[i];
		}
	} else {
		for(j = 0; j < q + 1;++j) {
			tempd = 0.0;
			for(i = 0; i < p + 1;++i) {
				for(l = 0; l < p + 1; ++l) {
					temp = j + i - l;
					if (temp < 0) {
						temp = -temp;
					}
					tempd += x[i]*x[l]*c[temp];
				}
			}
			c2[j] = tempd;
		}

	}

	//Step 3 Newton Raphson Method

	epsilon = 0.0001;

	for(i = 0; i <= q;++i) {
		tau[i] = 0.0;
		f[i] = 0.0;
	}
	tau[0] = sqrt(c2[0]);

	for(j = 0; j <= q;++j) {
		for(i = 0; i < q-j+1;++i) {
			f[j] += tau[i] * tau[i+j];
		}
		f[j] -= c2[j];
	}

	it1 = 0;

	while (array_max_abs(f,q+1) > epsilon && it1 < 200) {
		it1++;
		for(i = 0; i < q+1;++i) {
			t = i * (q+1);
			for(j = 0; j < q+1;++j) {
				tempd = 0.0;
				if (i + j <= q) {
					tempd=tempd+tau[i+j];
				}
				if (j - i >= 0 ) {
					tempd=tempd+tau[j-i];
				}
				T[t+j] = tempd;
			}
		}
		//mdisplay(T,q+1,q+1);
		ludecomp(T,q+1,ipiv2);
		linsolve(T,q+1,f,ipiv2,h);

		for(i = 0; i < q+1;++i) {
			tau[i] = tau[i] - h[i];
			f[i] = 0.0;
		}

		for(j = 0; j < q+1;++j) {
			for(i = 0; i < q-j+1;++i) {
				f[j]=f[j]+tau[i]*tau[i+j];
			}
			f[j] = f[j] - c2[j];
		}
	}

	for(j = 1; j < q+1;++j) {
		theta[j-1]=-1.0*tau[j]/tau[0];
	}


	free(c);
	free(cv);
	free(A);
	free(b);
	free(ipiv);
	free(c2);
	free(x);
	free(f);
	free(tau);
	free(T);
	free(ipiv2);
	free(h);

}